

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O0

bool __thiscall Vertex::doesMatchWithErrors(Vertex *this,string *sequence)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  bool local_39;
  int local_20;
  int local_1c;
  int i;
  int count;
  string *sequence_local;
  Vertex *this_local;
  
  local_1c = 0;
  local_20 = 0;
  do {
    iVar2 = std::__cxx11::string::size();
    if (iVar2 <= local_20) {
      if (this->treshhold < 6) {
        lVar4 = std::__cxx11::string::size();
        local_39 = lVar4 - 1U <= (ulong)(long)local_1c;
      }
      else {
        lVar4 = std::__cxx11::string::size();
        local_39 = lVar4 - 2U <= (ulong)(long)local_1c;
      }
      return local_39;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->seq_del);
    cVar1 = *pcVar3;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)sequence);
    if (cVar1 == *pcVar3) {
LAB_00102a82:
      local_1c = local_1c + 1;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->seq_del);
      if (*pcVar3 == 'X') goto LAB_00102a82;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)sequence);
      if (*pcVar3 == 'X') goto LAB_00102a82;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool Vertex::doesMatchWithErrors(string sequence){
    int count = 0;
    for(int i = 0; i < (int)sequence.size(); i++){
        if(this->seq_del[i] == sequence[i] or this->seq_del[i] == 'X' or sequence[i] == 'X'){
            count++;
        }
    }
    return this->treshhold > 5 ? count >= seq.size() - 2 : count >= seq.size() - 1;
}